

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_serialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  string *psVar1;
  byte bVar2;
  ostream *poVar3;
  ulong uVar4;
  t_type *ptVar5;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  undefined1 local_158 [8];
  string iter;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)ttype;
  ttype_local = (t_type *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_48);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_up((t_generator *)this);
  uVar4 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar5 = ttype_local;
  if ((uVar4 & 1) == 0) {
    uVar4 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar5 = ttype_local;
    if ((uVar4 & 1) == 0) {
      uVar4 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar5 = ttype_local;
      if ((uVar4 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_118);
        poVar3 = std::operator<<(poVar3,"await oprot.WriteListBeginAsync(new TList(");
        ptVar5 = t_list::get_elem_type((t_list *)prefix_local);
        type_to_enum_abi_cxx11_((string *)((long)&iter.field_2 + 8),this,ptVar5);
        poVar3 = std::operator<<(poVar3,(string *)(iter.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)prefix);
        poVar3 = std::operator<<(poVar3,".Count), ");
        poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,");");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(iter.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_d8);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteSetBeginAsync(new TSet(");
      ptVar5 = t_set::get_elem_type((t_set *)prefix_local);
      type_to_enum_abi_cxx11_(&local_f8,this,ptVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_f8);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".Count), ");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,"await oprot.WriteMapBeginAsync(new TMap(");
    ptVar5 = t_map::get_key_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_98,this,ptVar5);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,", ");
    ptVar5 = t_map::get_val_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_b8,this,ptVar5);
    poVar3 = std::operator<<(poVar3,(string *)&local_b8);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".Count), ");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"_iter",&local_179);
  t_generator::tmp((string *)local_158,(t_generator *)this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  bVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar5 = ttype_local;
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar5 = ttype_local;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar5 = ttype_local;
      if ((bVar2 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_220);
        poVar3 = std::operator<<(poVar3,"foreach (");
        ptVar5 = t_list::get_elem_type((t_list *)prefix_local);
        type_name_abi_cxx11_(&local_240,this,ptVar5,true);
        poVar3 = std::operator<<(poVar3,(string *)&local_240);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,(string *)local_158);
        poVar3 = std::operator<<(poVar3," in ");
        poVar3 = std::operator<<(poVar3,(string *)prefix);
        std::operator<<(poVar3,")");
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_1e0);
      poVar3 = std::operator<<(poVar3,"foreach (");
      ptVar5 = t_set::get_elem_type((t_set *)prefix_local);
      type_name_abi_cxx11_(&local_200,this,ptVar5,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)local_158);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_1a0);
    poVar3 = std::operator<<(poVar3,"foreach (");
    ptVar5 = t_map::get_key_type((t_map *)prefix_local);
    type_name_abi_cxx11_(&local_1c0,this,ptVar5,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_158);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    std::operator<<(poVar3,".Keys)");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  std::operator<<((ostream *)ttype_local,(string *)&::endl_abi_cxx11_);
  ptVar5 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_260);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_260);
  t_generator::indent_up((t_generator *)this);
  bVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar5 = ttype_local;
  psVar1 = prefix_local;
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar5 = ttype_local;
    psVar1 = prefix_local;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar5 = ttype_local;
      psVar1 = prefix_local;
      if ((bVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_2e0,(string *)local_158);
        generate_serialize_list_element(this,(ostream *)ptVar5,(t_list *)psVar1,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_2c0,(string *)local_158);
      generate_serialize_set_element(this,(ostream *)ptVar5,(t_set *)psVar1,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_280,(string *)local_158);
    std::__cxx11::string::string((string *)&local_2a0,(string *)prefix);
    generate_serialize_map_element(this,(ostream *)ptVar5,(t_map *)psVar1,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar5 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_300);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_300);
  bVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar5 = ttype_local;
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar5 = ttype_local;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar5 = ttype_local;
      if ((bVar2 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_360);
        poVar3 = std::operator<<(poVar3,"await oprot.WriteListEndAsync(");
        poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,");");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_360);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_340);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteSetEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_340);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_320);
    poVar3 = std::operator<<(poVar3,"await oprot.WriteMapEndAsync(");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_320);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar5 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar5,(string *)&local_380);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)local_158);
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapBeginAsync(new TMap(" << type_to_enum(static_cast<t_map*>(ttype)->get_key_type())
            << ", " << type_to_enum(static_cast<t_map*>(ttype)->get_val_type()) << ", " << prefix
            << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetBeginAsync(new TSet(" << type_to_enum(static_cast<t_set*>(ttype)->get_elem_type())
            << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListBeginAsync(new TList("
            << type_to_enum(static_cast<t_list*>(ttype)->get_elem_type()) << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");"
            << endl;
    }

    string iter = tmp("_iter");
    if (ttype->is_map())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_map*>(ttype)->get_key_type()) << " " << iter
            << " in " << prefix << ".Keys)";
    }
    else if (ttype->is_set())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_set*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }
    else if (ttype->is_list())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_list*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }

    out << endl;
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_serialize_map_element(out, static_cast<t_map*>(ttype), iter, prefix);
    }
    else if (ttype->is_set())
    {
        generate_serialize_set_element(out, static_cast<t_set*>(ttype), iter);
    }
    else if (ttype->is_list())
    {
        generate_serialize_list_element(out, static_cast<t_list*>(ttype), iter);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}